

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiListClipper::End(ImGuiListClipper *this)

{
  float fVar1;
  float fVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImGuiColumns *pIVar5;
  ImGuiContext *pIVar6;
  uint uVar7;
  float fVar8;
  
  pIVar6 = GImGui;
  iVar3 = this->ItemsCount;
  if (-1 < iVar3) {
    if (iVar3 != 0x7fffffff) {
      fVar1 = this->ItemsHeight;
      fVar8 = (float)iVar3 * fVar1 + this->StartPosY;
      pIVar4 = GImGui->CurrentWindow;
      (pIVar4->DC).CursorPos.y = fVar8;
      fVar2 = (pIVar4->DC).CursorMaxPos.y;
      uVar7 = -(uint)(fVar8 <= fVar2);
      (pIVar4->DC).CursorMaxPos.y = (float)(uVar7 & (uint)fVar2 | ~uVar7 & (uint)fVar8);
      (pIVar4->DC).CursorPosPrevLine.y = fVar8 - fVar1;
      (pIVar4->DC).PrevLineSize.y = fVar1 - (pIVar6->Style).ItemSpacing.y;
      pIVar5 = (pIVar4->DC).CurrentColumns;
      if (pIVar5 != (ImGuiColumns *)0x0) {
        pIVar5->LineMinY = fVar8;
      }
    }
    this->ItemsCount = -1;
    this->StepNo = 3;
  }
  return;
}

Assistant:

void ImGuiListClipper::End()
{
    if (ItemsCount < 0)
        return;
    // In theory here we should assert that ImGui::GetCursorPosY() == StartPosY + DisplayEnd * ItemsHeight, but it feels saner to just seek at the end and not assert/crash the user.
    if (ItemsCount < INT_MAX)
        SetCursorPosYAndSetupDummyPrevLine(StartPosY + ItemsCount * ItemsHeight, ItemsHeight); // advance cursor
    ItemsCount = -1;
    StepNo = 3;
}